

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O2

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
Assimp::FBX::FBXConverter::ConvertLine
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          FBXConverter *this,LineGeometry *line,Model *model,aiMatrix4x4 *node_global_transform,
          aiNode *nd)

{
  pointer __src;
  pointer piVar1;
  uint *puVar2;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *pvVar3;
  vector<int,_std::allocator<int>_> *pvVar4;
  aiMesh *paVar5;
  ulong uVar6;
  aiVector3D *__s;
  ulong *puVar7;
  aiFace *paVar8;
  uint *puVar9;
  uint uVar10;
  size_t __n;
  int iVar11;
  ulong uVar12;
  aiFace *paVar13;
  ulong uVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  format local_1a8;
  
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pvVar3 = LineGeometry::GetVertices(line);
  pvVar4 = LineGeometry::GetIndices(line);
  if (((pvVar3->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)._M_impl.
       super__Vector_impl_data._M_start !=
       (pvVar3->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)._M_impl.
       super__Vector_impl_data._M_finish) &&
     ((pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_start !=
      (pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish)) {
    paVar5 = SetupEmptyMesh(this,&line->super_Geometry,nd);
    *(byte *)&paVar5->mPrimitiveTypes = (byte)paVar5->mPrimitiveTypes | 2;
    uVar6 = ((long)(pvVar3->
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                   _M_impl.super__Vector_impl_data._M_finish -
            (long)(pvVar3->
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                  _M_impl.super__Vector_impl_data._M_start) / 0xc;
    paVar5->mNumVertices = (uint)uVar6;
    uVar6 = uVar6 & 0xffffffff;
    uVar14 = uVar6 * 0xc;
    __s = (aiVector3D *)operator_new__(uVar14);
    if (uVar6 != 0) {
      uVar14 = uVar14 - 0xc;
      memset(__s,0,(uVar14 - uVar14 % 0xc) + 0xc);
    }
    paVar5->mVertices = __s;
    __src = (pvVar3->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
            _M_impl.super__Vector_impl_data._M_start;
    __n = (long)(pvVar3->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)
                ._M_impl.super__Vector_impl_data._M_finish - (long)__src;
    if (__n != 0) {
      memmove(__s,__src,__n);
    }
    piVar1 = (pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_start;
    uVar6 = (long)(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)piVar1 >> 2;
    iVar11 = 0;
    for (uVar10 = 0; uVar10 < uVar6; uVar10 = uVar10 + 1) {
      iVar11 = iVar11 - (piVar1[uVar10] >> 0x1f);
    }
    uVar10 = (int)uVar6 - iVar11;
    uVar14 = (ulong)uVar10;
    paVar5->mNumFaces = uVar10;
    puVar7 = (ulong *)operator_new__(uVar14 * 0x10 + 8);
    *puVar7 = uVar14;
    paVar13 = (aiFace *)(puVar7 + 1);
    if ((int)uVar6 != iVar11) {
      paVar8 = paVar13;
      do {
        paVar8->mNumIndices = 0;
        paVar8->mIndices = (uint *)0x0;
        paVar8 = paVar8 + 1;
      } while (paVar8 != paVar13 + uVar14);
    }
    paVar5->mFaces = paVar13;
    uVar14 = 0;
    do {
      do {
        uVar12 = uVar14;
        uVar14 = uVar12 + 1;
        if (uVar14 - (uVar6 & 0xffffffff) == 1) {
          local_1a8._0_4_ =
               (int)((ulong)((long)(this->meshes).
                                   super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                                   super__Vector_impl_data._M_finish -
                            (long)(this->meshes).
                                  super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                                  super__Vector_impl_data._M_start) >> 3) + -1;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                    (__return_storage_ptr__,(uint *)&local_1a8);
          return __return_storage_ptr__;
        }
      } while ((pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start[uVar12] < 0);
      paVar13->mNumIndices = 2;
      puVar9 = (uint *)operator_new__(8);
      paVar13->mIndices = puVar9;
      puVar2 = paVar13->mIndices;
      paVar13 = paVar13 + 1;
      piVar1 = (pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      *puVar9 = piVar1[uVar12];
      uVar12 = 0;
      if (uVar14 != (uVar6 & 0xffffffff)) {
        uVar12 = uVar14 & 0xffffffff;
      }
      uVar10 = piVar1[uVar12];
      puVar2[1] = (int)uVar10 >> 0x1f ^ uVar10;
    } while( true );
  }
  std::operator+(&local_1c8,"ignoring empty line: ",&(line->super_Geometry).super_Object.name);
  Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
  basic_formatter<std::__cxx11::string>
            ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)&local_1a8,
             &local_1c8);
  LogFunctions<Assimp::FBXImporter>::LogWarn(&local_1a8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_1c8);
  return __return_storage_ptr__;
}

Assistant:

std::vector<unsigned int> FBXConverter::ConvertLine(const LineGeometry& line, const Model& model,
            const aiMatrix4x4& node_global_transform, aiNode& nd)
        {
            std::vector<unsigned int> temp;

            const std::vector<aiVector3D>& vertices = line.GetVertices();
            const std::vector<int>& indices = line.GetIndices();
            if (vertices.empty() || indices.empty()) {
                FBXImporter::LogWarn("ignoring empty line: " + line.Name());
                return temp;
            }

            aiMesh* const out_mesh = SetupEmptyMesh(line, nd);
            out_mesh->mPrimitiveTypes |= aiPrimitiveType_LINE;

            // copy vertices
            out_mesh->mNumVertices = static_cast<unsigned int>(vertices.size());
            out_mesh->mVertices = new aiVector3D[out_mesh->mNumVertices];
            std::copy(vertices.begin(), vertices.end(), out_mesh->mVertices);

            //Number of line segments (faces) is "Number of Points - Number of Endpoints"
            //N.B.: Endpoints in FbxLine are denoted by negative indices.
            //If such an Index is encountered, add 1 and multiply by -1 to get the real index.
            unsigned int epcount = 0;
            for (unsigned i = 0; i < indices.size(); i++)
            {
                if (indices[i] < 0) {
                    epcount++;
                }
            }
            unsigned int pcount = static_cast<unsigned int>( indices.size() );
            unsigned int scount = out_mesh->mNumFaces = pcount - epcount;

            aiFace* fac = out_mesh->mFaces = new aiFace[scount]();
            for (unsigned int i = 0; i < pcount; ++i) {
                if (indices[i] < 0) continue;
                aiFace& f = *fac++;
                f.mNumIndices = 2; //2 == aiPrimitiveType_LINE 
                f.mIndices = new unsigned int[2];
                f.mIndices[0] = indices[i];
                int segid = indices[(i + 1 == pcount ? 0 : i + 1)];   //If we have reached he last point, wrap around
                f.mIndices[1] = (segid < 0 ? (segid + 1)*-1 : segid); //Convert EndPoint Index to normal Index
            }
            temp.push_back(static_cast<unsigned int>(meshes.size() - 1));
            return temp;
        }